

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O0

void tunnel_free(Curl_cfilter *cf,Curl_easy *data)

{
  h1_tunnel_state_conflict *ts_00;
  h1_tunnel_state_conflict *ts;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  if ((cf != (Curl_cfilter *)0x0) &&
     (ts_00 = (h1_tunnel_state_conflict *)cf->ctx, ts_00 != (h1_tunnel_state_conflict *)0x0)) {
    h1_tunnel_go_state(cf,ts_00,H1_TUNNEL_FAILED,data);
    Curl_dyn_free((dynbuf *)ts_00);
    Curl_dyn_free(&ts_00->request_data);
    Curl_httpchunk_free(data,&ts_00->ch);
    (*Curl_cfree)(ts_00);
    cf->ctx = (void *)0x0;
  }
  return;
}

Assistant:

static void tunnel_free(struct Curl_cfilter *cf,
                        struct Curl_easy *data)
{
  if(cf) {
    struct h1_tunnel_state *ts = cf->ctx;
    if(ts) {
      h1_tunnel_go_state(cf, ts, H1_TUNNEL_FAILED, data);
      Curl_dyn_free(&ts->rcvbuf);
      Curl_dyn_free(&ts->request_data);
      Curl_httpchunk_free(data, &ts->ch);
      free(ts);
      cf->ctx = NULL;
    }
  }
}